

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

char * __thiscall NaVector::get_string(NaVector *this,char *szBuf,char *szDelim)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  char *unaff_R13;
  bool bVar8;
  double dVar9;
  char *szNext;
  char *local_38;
  
  cVar1 = *szBuf;
  while( true ) {
    iVar6 = (int)cVar1;
    iVar2 = isspace(iVar6);
    if (((iVar6 == 0) || (iVar2 == 0)) || (pcVar3 = strchr(szDelim,iVar6), pcVar3 == (char *)0x0))
    break;
    cVar1 = szBuf[1];
    szBuf = szBuf + 1;
  }
  uVar7 = 0;
  (*this->_vptr_NaVector[4])(this,0);
  do {
    cVar1 = *szBuf;
    iVar2 = (int)cVar1;
    iVar6 = isspace(iVar2);
    bVar8 = cVar1 == '\0';
    pcVar3 = szBuf;
    if ((!bVar8) && (iVar6 != 0)) {
      pcVar4 = strchr(szDelim,iVar2);
      while (pcVar4 != (char *)0x0) {
        pcVar3 = pcVar3 + 1;
        cVar1 = *pcVar3;
        iVar2 = (int)cVar1;
        iVar6 = isspace(iVar2);
        bVar8 = cVar1 == '\0';
        if ((bVar8) || (iVar6 == 0)) break;
        pcVar4 = strchr(szDelim,iVar2);
      }
    }
    if (bVar8) {
      return pcVar3;
    }
    pcVar4 = strchr(szDelim,iVar2);
    if (pcVar4 != (char *)0x0) {
      return pcVar3;
    }
    dVar9 = strtod(pcVar3,&local_38);
    pcVar4 = local_38;
    pcVar5 = pcVar3;
    szBuf = pcVar3;
    if (local_38 != pcVar3) {
      (*this->_vptr_NaVector[4])(this,(ulong)(uVar7 + 1));
      iVar2 = (*this->_vptr_NaVector[7])(this,(ulong)uVar7);
      *(double *)CONCAT44(extraout_var,iVar2) = dVar9;
      pcVar5 = unaff_R13;
      szBuf = pcVar4;
    }
    uVar7 = uVar7 + 1;
    unaff_R13 = pcVar5;
    if (pcVar4 == pcVar3) {
      return pcVar5;
    }
  } while( true );
}

Assistant:

const char*
NaVector::get_string (const char* szBuf, const char* szDelim)
{
    const char  *szPtr = szBuf;
    char        *szNext;
    unsigned    i;

    // skip leading spaces
    while(isspace(*szPtr) && *szPtr != '\0' &&
          NULL != strchr(szDelim, *szPtr))
        ++szPtr;

    new_dim(0);

    for(i = 0; ; ++i){
        //??? Strange things: szPtr value differs from (4) to (1) 
        //???NaPrintLog("get_string(1): szPtr='%s'(%p)\n", szPtr, szPtr);

        // skip leading spaces
        while(isspace(*szPtr) && *szPtr != '\0' &&
              NULL != strchr(szDelim, *szPtr))
            ++szPtr;

        //???NaPrintLog("get_string(2): szPtr='%s'(%p)\n", szPtr, szPtr);

        // while current string is not a delimiter and is not EOS...
        if('\0' == *szPtr || NULL != strchr(szDelim, *szPtr))
            break;

        // read number
        NaReal  fVal = strtod(szPtr, &szNext);
        //???NaPrintLog("get_string(): '%s' -> %g, next is '%s'\n",
        //???           szPtr, fVal, szNext);

        if(szNext == szPtr){
            // error while reading
            return szPtr;
        }
        szPtr = szNext;
        //???NaPrintLog("get_string(3): szPtr='%s'(%p)\n", szPtr, szPtr);

        new_dim(i + 1);
        fetch(i) = fVal;

        //???NaPrintLog("get_string(4): szPtr='%s'(%p)\n", szPtr, szPtr);
    }

    return szPtr;
}